

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

string * __thiscall
cmsys::SystemInformation::GetCPUDescription_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformation *this)

{
  ostream *poVar1;
  ulong uVar2;
  string sStack_1b8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&oss);
  std::operator<<(poVar1," core ");
  GetModelName_abi_cxx11_(&sStack_1b8,this);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  if (sStack_1b8._M_string_length == 0) {
    poVar1 = (ostream *)std::ostream::operator<<(&oss,this->Implementation->CPUSpeedInMHz);
    poVar1 = std::operator<<(poVar1," MHz ");
    poVar1 = std::operator<<(poVar1,(this->Implementation->ChipID).Vendor._M_dataplus._M_p);
    poVar1 = std::operator<<(poVar1," ");
    std::operator<<(poVar1,(this->Implementation->ChipID).ProcessorName._M_dataplus._M_p);
  }
  else {
    GetModelName_abi_cxx11_(&sStack_1b8,this);
    std::operator<<((ostream *)&oss,(string *)&sStack_1b8);
    std::__cxx11::string::~string((string *)&sStack_1b8);
  }
  std::__cxx11::stringbuf::str();
  while( true ) {
    uVar2 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x464158);
    if (uVar2 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,(char *)0x2);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformation::GetCPUDescription()
{
  std::ostringstream oss;
  oss << this->GetNumberOfPhysicalCPU() << " core ";
  if (this->GetModelName().empty()) {
    oss << this->GetProcessorClockFrequency() << " MHz "
        << this->GetVendorString() << " " << this->GetExtendedProcessorName();
  } else {
    oss << this->GetModelName();
  }

  // remove extra spaces
  std::string tmp = oss.str();
  size_t pos;
  while ((pos = tmp.find("  ")) != std::string::npos) {
    tmp.replace(pos, 2, " ");
  }

  return tmp;
}